

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scapp.h
# Opt level: O0

void __thiscall
scApp::scApp(scApp *this,string *version,string *defaultVersion,commandOptions *options)

{
  iterator __last;
  undefined8 in_RCX;
  undefined8 *in_RDI;
  int lastOptionIndex;
  option my_option_list [31];
  vector<argparser::option,_std::allocator<argparser::option>_> *this_00;
  __normal_iterator<const_argparser::option_*,_std::vector<argparser::option,_std::allocator<argparser::option>_>_>
  *in_stack_fffffffffffffba0;
  allocator<char> *in_stack_fffffffffffffbd0;
  option *in_stack_fffffffffffffbd8;
  undefined4 in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbe4;
  undefined4 uVar1;
  const_iterator in_stack_fffffffffffffbe8;
  option local_3f8;
  option local_3d8;
  option local_3b8;
  option local_398;
  commandOptions *in_stack_fffffffffffffc88;
  string *in_stack_fffffffffffffc90;
  string *in_stack_fffffffffffffc98;
  ktxApp *in_stack_fffffffffffffca0;
  option local_358;
  option local_338;
  option local_318;
  option local_2f8;
  option local_2d8;
  option local_2b8;
  option local_298;
  option local_278;
  option local_258;
  option local_238;
  option local_218;
  option local_1f8;
  option local_1d8;
  option local_1b8;
  option local_198;
  option local_178;
  option local_158;
  option local_138;
  option local_118;
  option local_f8;
  option local_d8;
  option local_b8;
  option local_98;
  option local_78;
  option local_58;
  allocator<char> local_21;
  undefined8 local_20;
  
  local_20 = in_RCX;
  ktxApp::ktxApp(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,
                 in_stack_fffffffffffffc88);
  *in_RDI = &PTR___cxa_pure_virtual_0027d4d8;
  in_RDI[0xf] = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
             (char *)in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  std::allocator<char>::~allocator(&local_21);
  std::__cxx11::string::string((string *)(in_RDI + 0x14));
  argparser::option::option
            ((option *)&stack0xfffffffffffffbe8,"zcmp",optional_argument,(int *)0x0,0x7a);
  argparser::option::option(&local_3f8,"no_multithreading",no_argument,(int *)0x0,0x4e);
  argparser::option::option(&local_3d8,"threads",required_argument,(int *)0x0,0x74);
  argparser::option::option(&local_3b8,"clevel",required_argument,(int *)0x0,99);
  argparser::option::option(&local_398,"qlevel",required_argument,(int *)0x0,0x71);
  argparser::option::option
            ((option *)&stack0xfffffffffffffc88,"max_endpoints",required_argument,(int *)0x0,0x65);
  argparser::option::option(&local_358,"endpoint_rdo_threshold",required_argument,(int *)0x0,0x45);
  argparser::option::option(&local_338,"max_selectors",required_argument,(int *)0x0,0x75);
  argparser::option::option(&local_318,"selector_rdo_threshold",required_argument,(int *)0x0,0x53);
  argparser::option::option(&local_2f8,"normal_mode",no_argument,(int *)0x0,0x6e);
  argparser::option::option(&local_2d8,"separate_rg_to_color_alpha",no_argument,(int *)0x0,1000);
  argparser::option::option(&local_2b8,"no_endpoint_rdo",no_argument,(int *)0x0,0x3e9);
  argparser::option::option(&local_298,"no_selector_rdo",no_argument,(int *)0x0,0x3ea);
  argparser::option::option(&local_278,"no_sse",no_argument,(int *)0x0,0x3f3);
  argparser::option::option(&local_258,"uastc_quality",required_argument,(int *)0x0,0x3eb);
  argparser::option::option(&local_238,"uastc_rdo_l",optional_argument,(int *)0x0,0x3ec);
  argparser::option::option(&local_218,"uastc_rdo_d",required_argument,(int *)0x0,0x3ed);
  argparser::option::option(&local_1f8,"uastc_rdo_b",optional_argument,(int *)0x0,0x3ee);
  argparser::option::option(&local_1d8,"uastc_rdo_s",optional_argument,(int *)0x0,0x3ef);
  argparser::option::option(&local_1b8,"uastc_rdo_f",no_argument,(int *)0x0,0x3f0);
  argparser::option::option(&local_198,"uastc_rdo_m",no_argument,(int *)0x0,0x3f1);
  argparser::option::option(&local_178,"verbose",no_argument,(int *)0x0,0x3f2);
  argparser::option::option(&local_158,"astc_blk_d",required_argument,(int *)0x0,0x3f4);
  argparser::option::option(&local_138,"astc_mode",required_argument,(int *)0x0,0x3f5);
  argparser::option::option(&local_118,"astc_quality",required_argument,(int *)0x0,0x3f6);
  argparser::option::option(&local_f8,"astc_perceptual",no_argument,(int *)0x0,0x3f7);
  argparser::option::option(&local_d8,"encode",required_argument,(int *)0x0,0x3f8);
  argparser::option::option(&local_b8,"input_swizzle",required_argument,(int *)0x0,0x44c);
  argparser::option::option(&local_98,"normalize",no_argument,(int *)0x0,0x3f9);
  argparser::option::option(&local_78,"bcmp",no_argument,(int *)0x0,0x62);
  argparser::option::option(&local_58,"uastc",optional_argument,(int *)0x0,0x3fa);
  uVar1 = 0x1f;
  this_00 = (vector<argparser::option,_std::allocator<argparser::option>_> *)(in_RDI + 8);
  __last = std::vector<argparser::option,_std::allocator<argparser::option>_>::begin(this_00);
  __gnu_cxx::
  __normal_iterator<argparser::option_const*,std::vector<argparser::option,std::allocator<argparser::option>>>
  ::__normal_iterator<argparser::option*>
            (in_stack_fffffffffffffba0,
             (__normal_iterator<argparser::option_*,_std::vector<argparser::option,_std::allocator<argparser::option>_>_>
              *)this_00);
  std::vector<argparser::option,std::allocator<argparser::option>>::insert<argparser::option*,void>
            ((vector<argparser::option,_std::allocator<argparser::option>_> *)
             CONCAT44(uVar1,in_stack_fffffffffffffbe0),in_stack_fffffffffffffbe8,
             in_stack_fffffffffffffbd8,__last._M_current);
  std::__cxx11::string::operator+=((string *)(in_RDI + 0xb),"z;Nt:c:q:e:E:u:S:nb");
  return;
}

Assistant:

scApp::scApp(string& version, string& defaultVersion,
             scApp::commandOptions& options)
      : ktxApp(version, defaultVersion, options), options(options)
{
  argparser::option my_option_list[] = {
      { "zcmp", argparser::option::optional_argument, NULL, 'z' },
      { "no_multithreading", argparser::option::no_argument, NULL, 'N' },
      { "threads", argparser::option::required_argument, NULL, 't' },
      { "clevel", argparser::option::required_argument, NULL, 'c' },
      { "qlevel", argparser::option::required_argument, NULL, 'q' },
      { "max_endpoints", argparser::option::required_argument, NULL, 'e' },
      { "endpoint_rdo_threshold", argparser::option::required_argument, NULL, 'E' },
      { "max_selectors", argparser::option::required_argument, NULL, 'u' },
      { "selector_rdo_threshold", argparser::option::required_argument, NULL, 'S' },
      { "normal_mode", argparser::option::no_argument, NULL, 'n' },
      { "separate_rg_to_color_alpha", argparser::option::no_argument, NULL, 1000 },
      { "no_endpoint_rdo", argparser::option::no_argument, NULL, 1001 },
      { "no_selector_rdo", argparser::option::no_argument, NULL, 1002 },
      { "no_sse", argparser::option::no_argument, NULL, 1011 },
      { "uastc_quality", argparser::option::required_argument, NULL, 1003 },
      { "uastc_rdo_l", argparser::option::optional_argument, NULL, 1004 },
      { "uastc_rdo_d", argparser::option::required_argument, NULL, 1005 },
      { "uastc_rdo_b", argparser::option::optional_argument, NULL, 1006 },
      { "uastc_rdo_s", argparser::option::optional_argument, NULL, 1007 },
      { "uastc_rdo_f", argparser::option::no_argument, NULL, 1008 },
      { "uastc_rdo_m", argparser::option::no_argument, NULL, 1009 },
      { "verbose", argparser::option::no_argument, NULL, 1010 },
      { "astc_blk_d", argparser::option::required_argument, NULL, 1012 },
      { "astc_mode", argparser::option::required_argument, NULL, 1013 },
      { "astc_quality", argparser::option::required_argument, NULL, 1014 },
      { "astc_perceptual", argparser::option::no_argument, NULL, 1015 },
      { "encode", argparser::option::required_argument, NULL, 1016 },
      { "input_swizzle", argparser::option::required_argument, NULL, 1100},
      { "normalize", argparser::option::no_argument, NULL, 1017 },
      // Deprecated options
      { "bcmp", argparser::option::no_argument, NULL, 'b' },
      { "uastc", argparser::option::optional_argument, NULL, 1018 }
  };
  const int lastOptionIndex = sizeof(my_option_list)
                              / sizeof(argparser::option);
  option_list.insert(option_list.begin(), my_option_list,
                     my_option_list + lastOptionIndex);
  short_opts += "z;Nt:c:q:e:E:u:S:nb";
}